

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckColor(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  TidyAllocator *pTVar2;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var3;
  Bool BVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ctmbstr color;
  tmbstr ptVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ctmbstr str;
  _colors *p_Var12;
  
  if ((attval == (AttVal *)0x0) || (color = attval->value, color == (ctmbstr)0x0)) {
    uVar5 = 0x256;
    goto LAB_0013cbec;
  }
  if (*color == '#') {
LAB_0013cbc8:
    BVar4 = IsValidColorCode(color + 1);
    if (BVar4 == no) {
LAB_0013cce8:
      BVar4 = prvTidyIsHTML5Mode(doc);
      lVar7 = 0;
      do {
        lVar9 = lVar7;
        if (lVar9 + 0x10 == 0x110) {
          if (BVar4 == no) goto LAB_0013cd5d;
          uVar11 = 0;
          goto LAB_0013cd35;
        }
        iVar6 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[0].name + lVar9));
        lVar7 = lVar9 + 0x10;
      } while (iVar6 != 0);
      p_Var12 = (_colors *)((long)&colors[0].name + lVar9);
      goto LAB_0013cd56;
    }
  }
  else {
    BVar4 = IsValidColorCode(color);
    if (BVar4 == no) {
      if (*color == '#') goto LAB_0013cbc8;
      goto LAB_0013cce8;
    }
    pTVar2 = doc->allocator;
    p_Var3 = pTVar2->vtbl->alloc;
    uVar5 = prvTidytmbstrlen(color);
    ptVar8 = (tmbstr)(*p_Var3)(pTVar2,(long)uVar5 + 2);
    *ptVar8 = '#';
    lVar7 = 1;
    do {
      cVar1 = color[lVar7 + -1];
      ptVar8[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (cVar1 != '\0');
    prvTidyReportAttrError(doc,node,attval,0x22a);
    (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
    attval->value = ptVar8;
    color = ptVar8;
  }
  if (*color == '#') {
    if (*(int *)((doc->config).value + 0x48) != 0) {
      BVar4 = prvTidyIsHTML5Mode(doc);
      lVar7 = -0x10;
      do {
        lVar9 = lVar7;
        if (lVar9 + 0x10 == 0x100) {
          if (BVar4 == no) goto LAB_0013cdcd;
          uVar11 = 0;
          goto LAB_0013cd7e;
        }
        iVar6 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[1].hex + lVar9));
        lVar7 = lVar9 + 0x10;
      } while (iVar6 != 0);
      str = *(ctmbstr *)((long)&colors[1].name + lVar9);
      if (str != (ctmbstr)0x0) goto LAB_0013cda2;
    }
    goto LAB_0013cdcd;
  }
  ptVar8 = attval->value;
  goto LAB_0013cdde;
  while( true ) {
    iVar6 = prvTidytmbstrcasecmp(color,extended_colors[uVar10].name);
    uVar11 = uVar10 + 1;
    if (iVar6 == 0) break;
LAB_0013cd35:
    uVar10 = uVar11;
    if (extended_colors[uVar10].name == (ctmbstr)0x0) goto LAB_0013cd5d;
  }
  p_Var12 = extended_colors + uVar10;
LAB_0013cd56:
  if (p_Var12->hex == (ctmbstr)0x0) {
LAB_0013cd5d:
    uVar5 = 0x22b;
LAB_0013cbec:
    prvTidyReportAttrError(doc,node,attval,uVar5);
    return;
  }
  goto LAB_0013cdcd;
  while( true ) {
    iVar6 = prvTidytmbstrcasecmp(color,extended_colors[uVar11].hex);
    uVar11 = uVar11 + 1;
    if (iVar6 == 0) break;
LAB_0013cd7e:
    str = extended_colors[uVar11].name;
    if (str == (ctmbstr)0x0) goto LAB_0013cdcd;
  }
LAB_0013cda2:
  (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
  color = prvTidytmbstrdup(doc->allocator,str);
  attval->value = color;
LAB_0013cdcd:
  ptVar8 = attval->value;
  if (*color == '#') {
    ptVar8 = prvTidytmbstrtoupper(ptVar8);
  }
  else {
LAB_0013cdde:
    ptVar8 = prvTidytmbstrtolower(ptVar8);
  }
  attval->value = ptVar8;
  return;
}

Assistant:

void CheckColor( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Bool valid = no;
    tmbstr given;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    given = attval->value;

    /* 727851 - add hash to hash-less color values */
    if (given[0] != '#' && (valid = IsValidColorCode(given)))
    {
        tmbstr cp, s;

        cp = s = (tmbstr) TidyDocAlloc(doc, 2 + TY_(tmbstrlen)(given));
        *cp++ = '#';
        while ('\0' != (*cp++ = *given++))
            continue;

        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE_REPLACED);

        TidyDocFree(doc, attval->value);
        given = attval->value = s;
    }

    if (!valid && given[0] == '#')
        valid = IsValidColorCode(given + 1);

    if (valid && given[0] == '#' && cfgBool(doc, TidyReplaceColor))
    {
        ctmbstr newName = GetColorName(given, TY_(IsHTML5Mode)(doc));

        if (newName)
        {
            TidyDocFree(doc, attval->value);
            given = attval->value = TY_(tmbstrdup)(doc->allocator, newName);
        }
    }

    /* if it is not a valid color code, it is a color name */
    if (!valid)
        valid = GetColorCode(given, TY_(IsHTML5Mode)(doc)) != NULL;

    if (valid && given[0] == '#')
        attval->value = TY_(tmbstrtoupper)(attval->value);
    else if (valid)
        attval->value = TY_(tmbstrtolower)(attval->value);

    if (!valid)
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}